

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BtreeLeave(Btree *p)

{
  Btree *p_local;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + -1, p->wantToLock == 0)) {
    unlockBtreeMutex(p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BtreeLeave(Btree *p){
  assert( sqlite3_mutex_held(p->db->mutex) );
  if( p->sharable ){
    assert( p->wantToLock>0 );
    p->wantToLock--;
    if( p->wantToLock==0 ){
      unlockBtreeMutex(p);
    }
  }
}